

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::replace_extension(path *this,path *replacement)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  char *pcVar4;
  ulong uVar5;
  impl_string_type local_40;
  
  bVar1 = has_extension(this);
  if (bVar1) {
    sVar3 = (this->_path)._M_string_length;
    extension((path *)&local_40,this);
    uVar5 = sVar3 - local_40._M_string_length;
    if ((this->_path)._M_string_length < uVar5) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar2);
    }
    (this->_path)._M_string_length = uVar5;
    (this->_path)._M_dataplus._M_p[uVar5] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = (replacement->_path)._M_dataplus._M_p;
  sVar3 = (replacement->_path)._M_string_length;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else if (*pcVar4 != '.') {
    std::__cxx11::string::push_back((char)this);
    pcVar4 = (replacement->_path)._M_dataplus._M_p;
    sVar3 = (replacement->_path)._M_string_length;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar4,pcVar4 + sVar3);
  postprocess_path_with_format(&local_40,(format)pcVar4);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::replace_extension(const path& replacement)
{
    if (has_extension()) {
        _path.erase(_path.size() - extension()._path.size());
    }
    if (!replacement.empty() && replacement._path[0] != '.') {
        _path += '.';
    }
    return concat(replacement);
}